

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_draw.cxx
# Opt level: O0

void gl_color(Fl_Color i)

{
  uchar local_f;
  uchar local_e;
  uchar local_d;
  Fl_Color local_c;
  uchar blue;
  uchar green;
  uchar red;
  Fl_Color i_local;
  
  local_c = i;
  Fl::get_color(i,&local_d,&local_e,&local_f);
  glColor3ub(local_d,local_e,local_f,local_d);
  return;
}

Assistant:

void gl_color(Fl_Color i) {
#if HAVE_GL_OVERLAY
#if defined(WIN32)
  if (fl_overlay && fl_overlay_depth) {
    if (fl_overlay_depth < 8) {
      // only black & white produce the expected colors.  This could
      // be improved by fixing the colormap set in Fl_Gl_Overlay.cxx
      int size = 1<<fl_overlay_depth;
      if (!i) glIndexi(size-2);
      else if (i >= size-2) glIndexi(size-1);
      else glIndexi(i);
    } else {
      glIndexi(i ? i : FL_GRAY_RAMP);
    }
    return;
  }
#else
  if (fl_overlay) {glIndexi(int(fl_xpixel(i))); return;}
#endif
#endif
  uchar red, green, blue;
  Fl::get_color(i, red, green, blue);
  glColor3ub(red, green, blue);
}